

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorGraph.hpp
# Opt level: O2

void __thiscall CoreML::LayerNode::LayerNode(LayerNode *this,LossLayer *lossLayer)

{
  MeanSquaredErrorLossLayer *pMVar1;
  
  (this->children).super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parents).super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->children).super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parents).super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parents).super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->inputNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inputNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inputNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outputNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outputNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outputNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)&this->name);
  if (lossLayer->_oneof_case_[0] == 10) {
    pMVar1 = (MeanSquaredErrorLossLayer *)
             Specification::LossLayer::categoricalcrossentropylosslayer(lossLayer);
  }
  else {
    if (lossLayer->_oneof_case_[0] != 0xb) goto LAB_00569bcb;
    pMVar1 = Specification::LossLayer::meansquarederrorlosslayer(lossLayer);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->inputNames,(pMVar1->input_).ptr_);
LAB_00569bcb:
  this->lossLayerType = lossLayer->_oneof_case_[0];
  this->layerType = LAYER_NOT_SET;
  this->isUpdatable = false;
  this->isBackPropagable = false;
  return;
}

Assistant:

LayerNode(const Specification::LossLayer *lossLayer)
    {
        name = lossLayer->name();

        switch (lossLayer->LossLayerType_case()) {
            case CoreML::Specification::LossLayer::kCategoricalCrossEntropyLossLayer:
                inputNames.push_back(lossLayer->categoricalcrossentropylosslayer().input());
                break;
            case CoreML::Specification::LossLayer::kMeanSquaredErrorLossLayer:
                inputNames.push_back(lossLayer->meansquarederrorlosslayer().input());
                break;
            default:
                break;
        }

        lossLayerType = lossLayer->LossLayerType_case();
        layerType = Specification::NeuralNetworkLayer::LAYER_NOT_SET;
        isUpdatable = false;
        isBackPropagable = false;
    }